

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetType(cmTarget *this,TargetType type,string *name)

{
  string *name_local;
  TargetType type_local;
  cmTarget *this_local;
  
  std::__cxx11::string::operator=((string *)&this->Name,(string *)name);
  this->TargetTypeValue = type;
  if (((int)this->TargetTypeValue < 1) || (3 < (int)this->TargetTypeValue)) {
    this->RecordDependencies = false;
  }
  else {
    this->RecordDependencies = true;
  }
  return;
}

Assistant:

void cmTarget::SetType(TargetType type, const std::string& name)
{
  this->Name = name;
  // only add dependency information for library targets
  this->TargetTypeValue = type;
  if(this->TargetTypeValue >= STATIC_LIBRARY
     && this->TargetTypeValue <= MODULE_LIBRARY)
    {
    this->RecordDependencies = true;
    }
  else
    {
    this->RecordDependencies = false;
    }
}